

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_setfenv(lua_State *L,int idx)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  TValue *pTVar4;
  int iVar5;
  TValue *pTVar6;
  global_State *g;
  
  pTVar6 = index2adr(L,idx);
  pTVar4 = L->top;
  uVar2 = pTVar4[-1].u32.lo;
  uVar3 = (pTVar6->field_2).it;
  if (uVar3 == 0xfffffff3) {
LAB_0010f920:
    *(uint *)((ulong)(pTVar6->u32).lo + 8) = uVar2;
  }
  else {
    if (uVar3 != 0xfffffff9) {
      if (uVar3 != 0xfffffff7) {
        iVar5 = 0;
        goto LAB_0010f973;
      }
      goto LAB_0010f920;
    }
    *(uint *)((ulong)(pTVar6->u32).lo + 0x2c) = uVar2;
  }
  if (((((GCobj *)(ulong)uVar2)->gch).marked & 3) != 0) {
    bVar1 = *(byte *)((ulong)(pTVar6->u32).lo + 4);
    if ((bVar1 & 4) != 0) {
      g = (global_State *)(ulong)(L->glref).ptr32;
      if ((byte)((g->gc).state - 1) < 2) {
        gc_mark(g,(GCobj *)(ulong)uVar2);
      }
      else {
        *(byte *)((ulong)(pTVar6->u32).lo + 4) = (g->gc).currentwhite & 3 | bVar1 & 0xf8;
      }
    }
  }
  pTVar4 = L->top;
  iVar5 = 1;
LAB_0010f973:
  L->top = pTVar4 + -1;
  return iVar5;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  GCtab *t;
  api_checknelems(L, 1);
  api_checkvalidindex(L, o);
  api_check(L, tvistab(L->top-1));
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}